

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O3

void __thiscall geemuboi::test::core::CpuTest_add_hl_sp_Test::TestBody(CpuTest_add_hl_sp_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  Registers local_14;
  
  (this->super_CpuTest).regs.f = 0x80;
  (this->super_CpuTest).regs.h = '\x01';
  (this->super_CpuTest).regs.l = '\x02';
  (this->super_CpuTest).regs.sp = 0x102;
  CpuTest::execute_instruction(&this->super_CpuTest,'9');
  local_14.a = '\0';
  local_14.b = '\0';
  local_14.c = '\0';
  local_14.d = '\0';
  local_14.e = '\0';
  local_14.h = '\x02';
  local_14.l = '\x04';
  local_14.f = 0x80;
  local_14.pc = 1;
  local_14.sp = 0x102;
  CpuTest::verify_state_changes(&this->super_CpuTest,&local_14);
  local_38.ss_.ptr_._0_4_ =
       (*((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_30.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_28,"cpu->get_cycles_executed()","2",(uint *)&local_38,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x45f,message);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (CONCAT44(local_38.ss_.ptr_._4_4_,(int)local_38.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,(int)local_38.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,(int)local_38.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_sp) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 1;
    regs.l = 2;
    regs.sp = 0x0102;
    execute_instruction(0x39);

    ICpu::Registers expected_regs{};
    expected_regs.sp = 0x0102;
    expected_regs.h = 2;
    expected_regs.l = 4;
    expected_regs.f = ICpu::Z_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}